

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

bool __thiscall
math::wide_integer::uintwide_t<32u,unsigned_char,void,true>::wr_string<char*>
          (uintwide_t<32u,unsigned_char,void,true> *this,char *str_result,uint_fast8_t base_rep,
          bool show_base,bool show_pos,bool is_uppercase,unsigned_fast_type field_width,
          char fill_char_str)

{
  bool bVar1;
  uchar uVar2;
  uintwide_t<32U,_unsigned_char,_void,_true> *v;
  unsigned_fast_type uVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  undefined7 in_register_00000011;
  undefined4 uVar7;
  ulong uVar8;
  undefined3 in_register_00000081;
  ulong uVar9;
  array<unsigned_char,_4UL> aVar10;
  uintwide_t<32U,_unsigned_char,_void,_false> t;
  byte local_68 [8];
  undefined8 uStack_60;
  undefined2 local_58;
  undefined1 local_56;
  char *local_50;
  array<unsigned_char,_4UL> local_44;
  undefined4 local_40;
  representation_type local_3c;
  representation_type local_38;
  uintwide_t<32U,_unsigned_char,_void,_true> tmp;
  
  iVar6 = (int)CONCAT71(in_register_00000011,base_rep);
  if (iVar6 == 0x10) {
    t.values.super_array<unsigned_char,_4UL>.elems = *(representation_type *)this;
    local_68[0] = 0;
    local_68[1] = 0;
    local_68[2] = 0;
    local_68[3] = 0;
    local_68[4] = 0;
    local_68[5] = 0;
    local_68[6] = 0;
    local_68[7] = 0;
    uStack_60 = 0;
    local_50 = str_result;
    bVar1 = uintwide_t<32U,_unsigned_char,_void,_false>::is_zero(&t);
    if (bVar1) {
      uStack_60 = (ulong)CONCAT16(0x30,(undefined6)uStack_60);
      uVar9 = 0xe;
    }
    else {
      uVar3 = uintwide_t<32U,_unsigned_char,_void,_true>::extract_hex_digits<false,_nullptr>
                        (&t,(char *)((long)&uStack_60 + 7),is_uppercase);
      uVar9 = 0xf - uVar3;
    }
    if ((show_base) && (1 < (long)uVar9)) {
      local_68[(int)uVar9 - 1] = !is_uppercase << 5 | 0x58;
      uVar9 = uVar9 - 2;
      local_68[uVar9 & 0xffffffff] = 0x30;
    }
    str_result = local_50;
    if ((show_pos) && (0 < (long)uVar9)) {
      uVar9 = uVar9 - 1;
      local_68[uVar9 & 0xffffffff] = 0x2b;
    }
    if (field_width != 0) {
      uVar8 = 0xf;
      if (field_width < 0xf) {
        uVar8 = field_width;
      }
      while ((long)(uVar8 ^ 0xf) < (long)uVar9) {
        uVar9 = uVar9 - 1;
        local_68[uVar9 & 0xffffffff] = fill_char_str;
      }
    }
    uStack_60 = uStack_60 & 0xffffffffffffff;
    goto LAB_00139503;
  }
  if (iVar6 == 10) {
    aVar10.elems = *(value_type_conflict4 (*) [4])this;
    t.values.super_array<unsigned_char,_4UL>.elems =
         (representation_type)(representation_type)aVar10.elems;
    if ((int)aVar10.elems < 0) {
      uintwide_t<32U,_unsigned_char,_void,_true>::negate
                ((uintwide_t<32U,_unsigned_char,_void,_true> *)&t);
    }
    local_68[0] = 0;
    local_68[1] = 0;
    local_68[2] = 0;
    local_68[3] = 0;
    local_68[4] = 0;
    local_68[5] = 0;
    local_68[6] = 0;
    local_68[7] = 0;
    uStack_60 = 0;
    local_58 = 0;
    bVar1 = uintwide_t<32U,_unsigned_char,_void,_true>::is_zero
                      ((uintwide_t<32U,_unsigned_char,_void,_true> *)&t);
    if (bVar1) {
      local_58 = CONCAT11(0x30,(undefined1)local_58);
      uVar9 = 0x11;
      uVar7 = CONCAT31(in_register_00000081,show_pos);
LAB_00139333:
      if ((byte)((int)aVar10.elems < 0 | (byte)uVar7) == 1) {
        bVar5 = 0x2d;
        if (-1 < (int)aVar10.elems) {
          bVar5 = ((byte)uVar7 ^ 1) * '\x02' + 0x2b;
        }
        uVar9 = uVar9 - 1;
        local_68[uVar9 & 0xffffffff] = bVar5;
      }
    }
    else {
      uVar9 = 0x12;
      local_50 = str_result;
      local_44.elems = aVar10.elems;
      local_40 = CONCAT31(in_register_00000081,show_pos);
      while ((bVar1 = uintwide_t<32U,_unsigned_char,_void,_true>::is_zero
                                ((uintwide_t<32U,_unsigned_char,_void,_true> *)&t), uVar9 != 0 &&
             (!bVar1))) {
        tmp.values.super_array<unsigned_char,_4UL>.elems =
             t.values.super_array<unsigned_char,_4UL>.elems;
        uintwide_t<32U,_unsigned_char,_void,_true>::eval_divide_by_single_limb
                  ((uintwide_t<32U,_unsigned_char,_void,_true> *)&t,'\n',0,
                   (uintwide_t<32U,_unsigned_char,_void,_true> *)0x0);
        local_3c.super_array<unsigned_char,_4UL>.elems =
             (array<unsigned_char,_4UL>)
             (array<unsigned_char,_4UL>)t.values.super_array<unsigned_char,_4UL>.elems;
        v = uintwide_t<32U,_unsigned_char,_void,_true>::mul_by_limb
                      ((uintwide_t<32U,_unsigned_char,_void,_true> *)&local_3c,'\n');
        local_38.super_array<unsigned_char,_4UL>.elems =
             (array<unsigned_char,_4UL>)wide_integer::operator-(&tmp,v);
        uVar2 = wide_integer::uintwide_t::operator_cast_to_unsigned_char((uintwide_t *)&local_38);
        uVar9 = uVar9 - 1;
        local_68[uVar9 & 0xffffffff] = uVar2 + 0x30;
      }
      str_result = local_50;
      uVar7 = local_40;
      aVar10.elems = local_44.elems;
      if (uVar9 != 0) goto LAB_00139333;
      uVar9 = 0;
    }
    if (field_width != 0) {
      lVar4 = 0;
      if (field_width < 0x13) {
        lVar4 = 0x12 - field_width;
      }
      while (lVar4 < (long)uVar9) {
        uVar9 = uVar9 - 1;
        local_68[uVar9 & 0xffffffff] = fill_char_str;
      }
    }
  }
  else {
    if (iVar6 != 8) {
      return false;
    }
    t.values.super_array<unsigned_char,_4UL>.elems = *(representation_type *)this;
    local_68[0] = 0;
    local_68[1] = 0;
    local_68[2] = 0;
    local_68[3] = 0;
    local_68[4] = 0;
    local_68[5] = 0;
    local_68[6] = 0;
    local_68[7] = 0;
    uStack_60 = 0;
    local_58 = 0;
    bVar1 = uintwide_t<32U,_unsigned_char,_void,_false>::is_zero(&t);
    if (bVar1) {
      local_58 = CONCAT11(0x30,(undefined1)local_58);
      uVar9 = 0x11;
    }
    else {
      uVar9 = 0x12;
      while ((bVar1 = uintwide_t<32U,_unsigned_char,_void,_false>::is_zero(&t), uVar9 != 0 &&
             (!bVar1))) {
        uVar9 = uVar9 - 1;
        local_68[uVar9 & 0xffffffff] = t.values.super_array<unsigned_char,_4UL>.elems[0] & 7 | 0x30;
        uintwide_t<32u,unsigned_char,void,false>::operator>>=
                  ((uintwide_t<32u,unsigned_char,void,false> *)&t,3);
      }
    }
    if (show_base && uVar9 != 0) {
      uVar9 = uVar9 - 1;
      local_68[uVar9 & 0xffffffff] = 0x30;
    }
    if (show_pos && uVar9 != 0) {
      uVar9 = uVar9 - 1;
      local_68[uVar9 & 0xffffffff] = 0x2b;
    }
    if (field_width != 0) {
      lVar4 = 0;
      if (field_width < 0x13) {
        lVar4 = 0x12 - field_width;
      }
      while (lVar4 < (long)uVar9) {
        uVar9 = uVar9 - 1;
        local_68[uVar9 & 0xffffffff] = fill_char_str;
      }
    }
  }
  local_56 = 0;
LAB_00139503:
  detail::strcpy_unsafe<char*,char*>(str_result,(char *)(local_68 + uVar9));
  return true;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }